

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O2

string * __thiscall
OpenMD::Stats::getStatsReport_abi_cxx11_(string *__return_storage_ptr__,Stats *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  ostream *poVar6;
  uint j;
  long lVar7;
  char *pcVar8;
  long lVar9;
  RealType RVar10;
  potVec s_1;
  double local_338;
  double local_330;
  Vector3d e;
  Vector3d s;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  string rlc;
  string rex;
  string ruc;
  string llc;
  string lex;
  string luc;
  string pm;
  string head;
  stringstream report;
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [88];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&report);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pm,anon_var_dwarf_3506d2,(allocator<char> *)&s_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&luc,anon_var_dwarf_3506de,(allocator<char> *)&s_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lex,anon_var_dwarf_3506ea,(allocator<char> *)&s_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&llc,anon_var_dwarf_3506f6,(allocator<char> *)&s_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ruc,anon_var_dwarf_350702,(allocator<char> *)&s_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rex,anon_var_dwarf_35070e,(allocator<char> *)&s_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rlc,anon_var_dwarf_35071a,(allocator<char> *)&s_1);
  plVar5 = (long *)__dynamic_cast(((this->data_).
                                   super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->accumulator,
                                  &BaseAccumulator::typeinfo,&Accumulator::typeinfo,0);
  iVar4 = (**(code **)(*plVar5 + 8))(plVar5);
  head._M_dataplus._M_p = (pointer)&head.field_2;
  std::__cxx11::string::_M_construct((ulong)&head,'O');
  poVar6 = std::operator<<((ostream *)local_1a8,(string *)&head);
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)local_1a8,"# Status Report:");
  s_1.data_[0] = (double)(s_1.data_ + 2);
  std::__cxx11::string::_M_construct((ulong)&s_1,'>');
  poVar6 = std::operator<<(poVar6,(string *)&s_1);
  poVar6 = std::operator<<(poVar6,"#");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::~string((string *)&s_1);
  poVar6 = std::operator<<((ostream *)local_1a8,"# ");
  lVar9 = *(long *)poVar6;
  lVar7 = *(long *)(lVar9 + -0x18);
  *(uint *)(poVar6 + lVar7 + 0x18) = *(uint *)(poVar6 + lVar7 + 0x18) & 0xffffff4f | 0x80;
  *(undefined8 *)(poVar6 + *(long *)(lVar9 + -0x18) + 0x10) = 0x18;
  std::operator<<(poVar6,"Total Time:");
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xc;
  RVar10 = getRealData(this,0);
  std::ostream::_M_insert<double>(RVar10);
  poVar6 = std::operator<<((ostream *)local_1a8," ");
  lVar9 = *(long *)poVar6;
  *(undefined8 *)(poVar6 + *(long *)(lVar9 + -0x18) + 0x10) = 0x11;
  lVar9 = *(long *)(lVar9 + -0x18);
  *(uint *)(poVar6 + lVar9 + 0x18) = *(uint *)(poVar6 + lVar9 + 0x18) & 0xffffff4f | 0x20;
  std::__cxx11::string::string
            ((string *)&s_1,
             (string *)
             &((this->data_).
               super__Vector_base<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>
               ._M_impl.super__Vector_impl_data._M_start)->units);
  poVar6 = std::operator<<(poVar6,(string *)&s_1);
  poVar6 = std::operator<<(poVar6,"                      #");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::~string((string *)&s_1);
  poVar6 = std::operator<<((ostream *)local_1a8,"# ");
  lVar9 = *(long *)poVar6;
  lVar7 = *(long *)(lVar9 + -0x18);
  *(uint *)(poVar6 + lVar7 + 0x18) = *(uint *)(poVar6 + lVar7 + 0x18) & 0xffffff4f | 0x80;
  *(undefined8 *)(poVar6 + *(long *)(lVar9 + -0x18) + 0x10) = 0x18;
  std::operator<<(poVar6,"Number of Samples:");
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xc;
  std::ostream::operator<<((ostream *)local_1a8,iVar4);
  poVar6 = std::operator<<((ostream *)local_1a8,"                                        #");
  std::endl<char,std::char_traits<char>>(poVar6);
  for (lVar9 = 0; lVar7 = 1, lVar9 != 0x2e; lVar9 = lVar9 + 1) {
    iVar4 = (int)lVar9;
    if ((lVar9 != 0) &&
       ((1L << ((byte)lVar9 & 0x3f) & (this->statsMask_).super__Base_bitset<1UL>._M_w) != 0)) {
      getDataType_abi_cxx11_((string *)&s_1,this,iVar4);
      bVar3 = std::operator==((string *)&s_1,"RealType");
      std::__cxx11::string::~string((string *)&s_1);
      if (bVar3) {
        poVar6 = std::operator<<((ostream *)local_1a8,"# ");
        lVar7 = *(long *)poVar6;
        lVar1 = *(long *)(lVar7 + -0x18);
        *(uint *)(poVar6 + lVar1 + 0x18) = *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x80;
        *(undefined8 *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = 0x17;
        getTitle_abi_cxx11_((string *)&s_1,this,iVar4);
        poVar6 = std::operator<<(poVar6,(string *)&s_1);
        std::operator<<(poVar6,":");
        std::__cxx11::string::~string((string *)&s_1);
        *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x80;
        *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xc;
        RVar10 = getRealAverage(this,iVar4);
        std::ostream::_M_insert<double>(RVar10);
        poVar6 = std::operator<<((ostream *)local_1a8,(string *)&pm);
        lVar7 = *(long *)poVar6;
        lVar1 = *(long *)(lVar7 + -0x18);
        *(uint *)(poVar6 + lVar1 + 0x18) = *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x20;
        *(undefined8 *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = 0xc;
        RVar10 = getRealError(this,iVar4);
        std::ostream::_M_insert<double>(RVar10);
        poVar6 = std::operator<<((ostream *)local_1a8," ");
        lVar7 = *(long *)poVar6;
        lVar1 = *(long *)(lVar7 + -0x18);
        *(uint *)(poVar6 + lVar1 + 0x18) = *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x20;
        *(undefined8 *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = 0x11;
        getUnits_abi_cxx11_((string *)&s_1,this,iVar4);
        std::operator<<(poVar6,(string *)&s_1);
        std::__cxx11::string::~string((string *)&s_1);
        poVar6 = std::operator<<((ostream *)local_1a8,"     #");
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      else {
        getDataType_abi_cxx11_((string *)&s_1,this,iVar4);
        bVar3 = std::operator==((string *)&s_1,"Vector3d");
        std::__cxx11::string::~string((string *)&s_1);
        if (bVar3) {
          getVectorAverage(&s,this,iVar4);
          getVectorError(&e,this,iVar4);
          std::operator<<((ostream *)local_1a8,"#                         ");
          poVar6 = std::operator<<((ostream *)local_1a8,(string *)&luc);
          lVar7 = *(long *)poVar6;
          lVar1 = *(long *)(lVar7 + -0x18);
          *(uint *)(poVar6 + lVar1 + 0x18) = *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = 0xc;
          poVar6 = std::ostream::_M_insert<double>(s.super_Vector<double,_3U>.data_[0]);
          poVar6 = std::operator<<(poVar6,(string *)&ruc);
          std::operator<<(poVar6,"     ");
          poVar6 = std::operator<<((ostream *)local_1a8,(string *)&luc);
          lVar7 = *(long *)poVar6;
          lVar1 = *(long *)(lVar7 + -0x18);
          *(uint *)(poVar6 + lVar1 + 0x18) = *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = 0xc;
          std::ostream::_M_insert<double>(e.super_Vector<double,_3U>.data_[0]);
          poVar6 = std::operator<<((ostream *)local_1a8,(string *)&ruc);
          poVar6 = std::operator<<(poVar6,"                   #");
          std::endl<char,std::char_traits<char>>(poVar6);
          poVar6 = std::operator<<((ostream *)local_1a8,"# ");
          lVar7 = *(long *)poVar6;
          lVar1 = *(long *)(lVar7 + -0x18);
          *(uint *)(poVar6 + lVar1 + 0x18) = *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = 0x17;
          getTitle_abi_cxx11_((string *)&s_1,this,iVar4);
          poVar6 = std::operator<<(poVar6,(string *)&s_1);
          std::operator<<(poVar6,":");
          std::__cxx11::string::~string((string *)&s_1);
          poVar6 = std::operator<<((ostream *)local_1a8,(string *)&lex);
          lVar7 = *(long *)poVar6;
          lVar1 = *(long *)(lVar7 + -0x18);
          *(uint *)(poVar6 + lVar1 + 0x18) = *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = 0xc;
          poVar6 = std::ostream::_M_insert<double>(s.super_Vector<double,_3U>.data_[1]);
          poVar6 = std::operator<<(poVar6,(string *)&rex);
          std::operator<<(poVar6,(string *)&pm);
          poVar6 = std::operator<<((ostream *)local_1a8,(string *)&lex);
          lVar7 = *(long *)poVar6;
          lVar1 = *(long *)(lVar7 + -0x18);
          *(uint *)(poVar6 + lVar1 + 0x18) = *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = 0xc;
          poVar6 = std::ostream::_M_insert<double>(e.super_Vector<double,_3U>.data_[1]);
          poVar6 = std::operator<<(poVar6,(string *)&rex);
          std::operator<<(poVar6," ");
          *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
               *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
          *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0x11;
          getUnits_abi_cxx11_((string *)&s_1,this,iVar4);
          poVar6 = std::operator<<((ostream *)local_1a8,(string *)&s_1);
          std::operator<<(poVar6," #");
          std::__cxx11::string::~string((string *)&s_1);
          std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
          std::operator<<((ostream *)local_1a8,"#                         ");
          poVar6 = std::operator<<((ostream *)local_1a8,(string *)&llc);
          lVar7 = *(long *)poVar6;
          lVar1 = *(long *)(lVar7 + -0x18);
          *(uint *)(poVar6 + lVar1 + 0x18) = *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = 0xc;
          poVar6 = std::ostream::_M_insert<double>(s.super_Vector<double,_3U>.data_[2]);
          poVar6 = std::operator<<(poVar6,(string *)&rlc);
          std::operator<<(poVar6,"     ");
          poVar6 = std::operator<<((ostream *)local_1a8,(string *)&llc);
          lVar7 = *(long *)poVar6;
          lVar1 = *(long *)(lVar7 + -0x18);
          *(uint *)(poVar6 + lVar1 + 0x18) = *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x80;
          *(undefined8 *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = 0xc;
          std::ostream::_M_insert<double>(e.super_Vector<double,_3U>.data_[2]);
          poVar6 = std::operator<<((ostream *)local_1a8,(string *)&rlc);
          poVar6 = std::operator<<(poVar6,"                   #");
          std::endl<char,std::char_traits<char>>(poVar6);
        }
        else {
          getDataType_abi_cxx11_((string *)&s_1,this,iVar4);
          bVar3 = std::operator==((string *)&s_1,"potVec");
          std::__cxx11::string::~string((string *)&s_1);
          if (bVar3) {
            getPotVecAverage(&s_1,this,iVar4);
            getPotVecError((potVec *)&s,this,iVar4);
            poVar6 = std::operator<<((ostream *)local_1a8,"# ");
            lVar1 = *(long *)poVar6;
            lVar2 = *(long *)(lVar1 + -0x18);
            *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffff4f | 0x80;
            *(undefined8 *)(poVar6 + *(long *)(lVar1 + -0x18) + 0x10) = 0x17;
            getTitle_abi_cxx11_((string *)&e,this,iVar4);
            std::operator<<(poVar6,(string *)&e);
            std::__cxx11::string::~string((string *)&e);
            std::operator<<((ostream *)local_1a8,
                            ":                                                    #");
            std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
            for (; lVar7 != 7; lVar7 = lVar7 + 1) {
              switch((int)lVar7) {
              case 1:
                poVar6 = std::operator<<((ostream *)local_1a8,"# ");
                pcVar8 = "van der Waals:";
                break;
              case 2:
                poVar6 = std::operator<<((ostream *)local_1a8,"# ");
                pcVar8 = "Electrostatic:";
                break;
              default:
                poVar6 = std::operator<<((ostream *)local_1a8,"# ");
                pcVar8 = "Unknown:";
                break;
              case 5:
                poVar6 = std::operator<<((ostream *)local_1a8,"# ");
                pcVar8 = "Hydrogen Bonding:";
                break;
              case 6:
                poVar6 = std::operator<<((ostream *)local_1a8,"# ");
                pcVar8 = "Bonded (1-2,1-3,1-4):";
              }
              lVar1 = *(long *)poVar6;
              lVar2 = *(long *)(lVar1 + -0x18);
              *(uint *)(poVar6 + lVar2 + 0x18) =
                   *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar6 + *(long *)(lVar1 + -0x18) + 0x10) = 0x18;
              std::operator<<(poVar6,pcVar8);
              *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xc;
              std::ostream::_M_insert<double>(s_1.data_[lVar7]);
              poVar6 = std::operator<<((ostream *)local_1a8,(string *)&pm);
              lVar1 = *(long *)poVar6;
              lVar2 = *(long *)(lVar1 + -0x18);
              *(uint *)(poVar6 + lVar2 + 0x18) =
                   *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffff4f | 0x20;
              *(undefined8 *)(poVar6 + *(long *)(lVar1 + -0x18) + 0x10) = 0xc;
              std::ostream::_M_insert<double>(s.super_Vector<double,_3U>.data_[lVar7]);
              poVar6 = std::operator<<((ostream *)local_1a8," ");
              lVar1 = *(long *)poVar6;
              lVar2 = *(long *)(lVar1 + -0x18);
              *(uint *)(poVar6 + lVar2 + 0x18) =
                   *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffff4f | 0x20;
              *(undefined8 *)(poVar6 + *(long *)(lVar1 + -0x18) + 0x10) = 0x11;
              getUnits_abi_cxx11_((string *)&e,this,iVar4);
              poVar6 = std::operator<<(poVar6,(string *)&e);
              std::operator<<(poVar6,"     #");
              std::__cxx11::string::~string((string *)&e);
              std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
            }
          }
          else {
            getDataType_abi_cxx11_((string *)&s_1,this,iVar4);
            bVar3 = std::operator==((string *)&s_1,"Mat3x3d");
            std::__cxx11::string::~string((string *)&s_1);
            if (bVar3) {
              getMatrixAverage((Mat3x3d *)&s_1,this,iVar4);
              getMatrixError((Mat3x3d *)&s,this,iVar4);
              std::operator<<((ostream *)local_1a8,"#                         ");
              poVar6 = std::operator<<((ostream *)local_1a8,(string *)&luc);
              lVar7 = *(long *)poVar6;
              lVar1 = *(long *)(lVar7 + -0x18);
              *(uint *)(poVar6 + lVar1 + 0x18) =
                   *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = 0xc;
              poVar6 = std::ostream::_M_insert<double>(s_1.data_[0]);
              std::operator<<(poVar6," ");
              *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xc;
              poVar6 = std::ostream::_M_insert<double>(s_1.data_[1]);
              std::operator<<(poVar6," ");
              *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xc;
              poVar6 = std::ostream::_M_insert<double>(s_1.data_[2]);
              poVar6 = std::operator<<(poVar6,(string *)&ruc);
              std::operator<<(poVar6,"            #");
              std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
              poVar6 = std::operator<<((ostream *)local_1a8,"# ");
              lVar7 = *(long *)poVar6;
              lVar1 = *(long *)(lVar7 + -0x18);
              *(uint *)(poVar6 + lVar1 + 0x18) =
                   *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = 0x17;
              getTitle_abi_cxx11_((string *)&e,this,iVar4);
              poVar6 = std::operator<<(poVar6,(string *)&e);
              std::operator<<(poVar6,":");
              std::__cxx11::string::~string((string *)&e);
              poVar6 = std::operator<<((ostream *)local_1a8,(string *)&lex);
              lVar7 = *(long *)poVar6;
              lVar1 = *(long *)(lVar7 + -0x18);
              *(uint *)(poVar6 + lVar1 + 0x18) =
                   *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = 0xc;
              poVar6 = std::ostream::_M_insert<double>(s_1.data_[3]);
              std::operator<<(poVar6," ");
              *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xc;
              poVar6 = std::ostream::_M_insert<double>(s_1.data_[4]);
              std::operator<<(poVar6," ");
              *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xc;
              poVar6 = std::ostream::_M_insert<double>(s_1.data_[5]);
              poVar6 = std::operator<<(poVar6,(string *)&rex);
              std::operator<<(poVar6," ");
              *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f |
                   0x20;
              *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xb;
              getUnits_abi_cxx11_((string *)&e,this,iVar4);
              poVar6 = std::operator<<((ostream *)local_1a8,(string *)&e);
              poVar6 = std::operator<<(poVar6,"#");
              std::endl<char,std::char_traits<char>>(poVar6);
              std::__cxx11::string::~string((string *)&e);
              std::operator<<((ostream *)local_1a8,"#                         ");
              poVar6 = std::operator<<((ostream *)local_1a8,(string *)&llc);
              lVar7 = *(long *)poVar6;
              lVar1 = *(long *)(lVar7 + -0x18);
              *(uint *)(poVar6 + lVar1 + 0x18) =
                   *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = 0xc;
              poVar6 = std::ostream::_M_insert<double>(s_1.data_[6]);
              std::operator<<(poVar6," ");
              *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xc;
              poVar6 = std::ostream::_M_insert<double>(local_338);
              std::operator<<(poVar6," ");
              *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xc;
              poVar6 = std::ostream::_M_insert<double>(local_330);
              poVar6 = std::operator<<(poVar6,(string *)&rlc);
              std::operator<<(poVar6,"            #");
              std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
              std::operator<<((ostream *)local_1a8,"#                                 ");
              poVar6 = std::operator<<((ostream *)local_1a8,(string *)&luc);
              lVar7 = *(long *)poVar6;
              lVar1 = *(long *)(lVar7 + -0x18);
              *(uint *)(poVar6 + lVar1 + 0x18) =
                   *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = 0xc;
              poVar6 = std::ostream::_M_insert<double>(s.super_Vector<double,_3U>.data_[0]);
              std::operator<<(poVar6," ");
              *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xc;
              poVar6 = std::ostream::_M_insert<double>(s.super_Vector<double,_3U>.data_[1]);
              std::operator<<(poVar6," ");
              *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xc;
              poVar6 = std::ostream::_M_insert<double>(s.super_Vector<double,_3U>.data_[2]);
              poVar6 = std::operator<<(poVar6,(string *)&ruc);
              std::operator<<(poVar6,"    #");
              std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
              poVar6 = std::operator<<((ostream *)local_1a8,"#                            ");
              std::operator<<(poVar6,(string *)&pm);
              poVar6 = std::operator<<((ostream *)local_1a8,(string *)&lex);
              lVar7 = *(long *)poVar6;
              lVar1 = *(long *)(lVar7 + -0x18);
              *(uint *)(poVar6 + lVar1 + 0x18) =
                   *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = 0xc;
              poVar6 = std::ostream::_M_insert<double>(local_2e8);
              std::operator<<(poVar6," ");
              *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xc;
              poVar6 = std::ostream::_M_insert<double>(local_2e0);
              std::operator<<(poVar6," ");
              *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xc;
              poVar6 = std::ostream::_M_insert<double>(local_2d8);
              poVar6 = std::operator<<(poVar6,(string *)&rex);
              std::operator<<(poVar6,"    #");
              std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
              std::operator<<((ostream *)local_1a8,"#                                 ");
              poVar6 = std::operator<<((ostream *)local_1a8,(string *)&llc);
              lVar7 = *(long *)poVar6;
              lVar1 = *(long *)(lVar7 + -0x18);
              *(uint *)(poVar6 + lVar1 + 0x18) =
                   *(uint *)(poVar6 + lVar1 + 0x18) & 0xffffff4f | 0x80;
              *(undefined8 *)(poVar6 + *(long *)(lVar7 + -0x18) + 0x10) = 0xc;
              poVar6 = std::ostream::_M_insert<double>(local_2d0);
              std::operator<<(poVar6," ");
              *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xc;
              poVar6 = std::ostream::_M_insert<double>(local_2c8);
              std::operator<<(poVar6," ");
              *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f |
                   0x80;
              *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xc;
              poVar6 = std::ostream::_M_insert<double>(local_2c0);
              poVar6 = std::operator<<(poVar6,(string *)&rlc);
              std::operator<<(poVar6,"    #");
              std::endl<char,std::char_traits<char>>((ostream *)local_1a8);
            }
          }
        }
      }
    }
  }
  poVar6 = std::operator<<((ostream *)local_1a8,(string *)&head);
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&head);
  std::__cxx11::string::~string((string *)&rlc);
  std::__cxx11::string::~string((string *)&rex);
  std::__cxx11::string::~string((string *)&ruc);
  std::__cxx11::string::~string((string *)&llc);
  std::__cxx11::string::~string((string *)&lex);
  std::__cxx11::string::~string((string *)&luc);
  std::__cxx11::string::~string((string *)&pm);
  std::__cxx11::stringstream::~stringstream((stringstream *)&report);
  return __return_storage_ptr__;
}

Assistant:

std::string Stats::getStatsReport() {
    std::stringstream report;
#if defined(_MSC_VER)
    std::string pm  = " +/- ";
    std::string luc = "[";
    std::string lex = "|";
    std::string llc = "[";
    std::string ruc = "]";
    std::string rex = "|";
    std::string rlc = "]";
#else
    std::string pm  = "  \u00B1  ";
    std::string luc = "\u23A1";
    std::string lex = "\u23A2";
    std::string llc = "\u23A3";
    std::string ruc = "\u23A4";
    std::string rex = "\u23A5";
    std::string rlc = "\u23A6";
#endif

    int nSamp = dynamic_cast<Accumulator*>(data_[TIME].accumulator)->count();

    std::string head(79, '#');
    report << head << std::endl;
    report << "# Status Report:" << std::string(62, ' ') << "#" << std::endl;
    report << "# " << right << setw(24) << "Total Time:";
    report << setw(12) << getRealData(TIME);
    report << " " << setw(17) << left << getUnits(TIME)
           << "                      #" << std::endl;
    report << "# " << right << setw(24) << "Number of Samples:";
    report << setw(12) << nSamp;
    report << "                                        #" << std::endl;

    for (unsigned int i = 0; i < statsMask_.size(); ++i) {
      if (statsMask_[i] && i != TIME) {
        if (getDataType(i) == "RealType") {
          report << "# " << right << setw(23) << getTitle(i) << ":";
          report << right << setw(12) << getRealAverage(i);
          report << pm << left << setw(12) << getRealError(i);
          report << " " << left << setw(17) << getUnits(i);
          report << "     #" << std::endl;

        } else if (getDataType(i) == "Vector3d") {
          Vector3d s = getVectorAverage(i);
          Vector3d e = getVectorError(i);

          report << "#                         ";
          report << luc << right << setw(12) << s(0) << ruc << "     ";
          report << luc << right << setw(12) << e(0);
          report << ruc << "                   #" << std::endl;

          report << "# " << right << setw(23) << getTitle(i) << ":";

          report << lex << right << setw(12) << s(1) << rex << pm;
          report << lex << right << setw(12) << e(1) << rex << " ";
          report << left << setw(17) << getUnits(i) << " #";
          report << std::endl;

          report << "#                         ";
          report << llc << right << setw(12) << s(2) << rlc << "     ";
          report << llc << right << setw(12) << e(2);
          report << rlc << "                   #" << std::endl;

        } else if (getDataType(i) == "potVec") {
          potVec s = getPotVecAverage(i);
          potVec e = getPotVecError(i);

          report << "# " << right << setw(23) << getTitle(i);
          report << ":                                                    #";
          report << std::endl;

          for (unsigned int j = 1; j < N_INTERACTION_FAMILIES; j++) {
            switch (j) {
            case VANDERWAALS_FAMILY:
              report << "# " << right << setw(24) << "van der Waals:";
              break;
            case ELECTROSTATIC_FAMILY:
              report << "# " << right << setw(24) << "Electrostatic:";
              break;
            case METALLIC_EMBEDDING:
              report << "# " << right << setw(24) << "Metallic Embedding:";
              break;
            case METALLIC_PAIR:
              report << "# " << right << setw(24) << "Metallic Pair:";
              break;
            case HYDROGENBONDING_FAMILY:
              report << "# " << right << setw(24) << "Hydrogen Bonding:";
              break;
            case BONDED_FAMILY:
              report << "# " << right << setw(24) << "Bonded (1-2,1-3,1-4):";
              break;
            default:
              report << "# " << right << setw(24) << "Unknown:";
              break;
            }
            report << right << setw(12) << s[j];
            report << pm << left << setw(12) << e[j];
            report << " " << left << setw(17) << getUnits(i) << "     #";
            report << std::endl;
          }

        } else if (getDataType(i) == "Mat3x3d") {
          Mat3x3d s = getMatrixAverage(i);
          Mat3x3d e = getMatrixError(i);

          report << "#                         ";
          report << luc << right << setw(12) << s(0, 0) << " ";
          report << right << setw(12) << s(0, 1) << " ";
          report << right << setw(12) << s(0, 2) << ruc << "            #";
          report << std::endl;

          report << "# " << right << setw(23) << getTitle(i) << ":";

          report << lex << right << setw(12) << s(1, 0) << " ";
          report << right << setw(12) << s(1, 1) << " ";
          report << right << setw(12) << s(1, 2) << rex << " ";
          report << left << setw(11) << getUnits(i) << "#" << std::endl;

          report << "#                         ";
          report << llc << right << setw(12) << s(2, 0) << " ";
          report << right << setw(12) << s(2, 1) << " ";
          report << right << setw(12) << s(2, 2) << rlc << "            #";
          report << std::endl;

          report << "#                                 ";
          report << luc << right << setw(12) << e(0, 0) << " ";
          report << right << setw(12) << e(0, 1) << " ";
          report << right << setw(12) << e(0, 2) << ruc << "    #";
          report << std::endl;

          report << "#                            " << pm;

          report << lex << right << setw(12) << e(1, 0) << " ";
          report << right << setw(12) << e(1, 1) << " ";
          report << right << setw(12) << e(1, 2) << rex << "    #";
          report << std::endl;

          report << "#                                 ";
          report << llc << right << setw(12) << e(2, 0) << " ";
          report << right << setw(12) << e(2, 1) << " ";
          report << right << setw(12) << e(2, 2) << rlc << "    #";
          report << std::endl;
        }
      }
    }
    report << head << std::endl;

    return report.str();
  }